

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covscript.cpp
# Opt level: O2

int cs::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  any local_10;
  
  local_10.mDat = *__child_stack;
  if (local_10.mDat != (proxy *)0x0) {
    (local_10.mDat)->refcount = (local_10.mDat)->refcount + 1;
  }
  copy((EVP_PKEY_CTX *)__fn,(EVP_PKEY_CTX *)&local_10);
  cs_impl::any::recycle(&local_10);
  return (int)__fn;
}

Assistant:

var clone(const var &val)
	{
		return copy(val);
	}